

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mio.hpp
# Opt level: O0

void __thiscall
mio::basic_mmap<(mio::access_mode)0,char>::map<std::__cxx11::string>
          (basic_mmap<(mio::access_mode)0,char> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path,size_type offset,
          size_type length,error_code *error)

{
  bool bVar1;
  file_handle_type handle_00;
  error_code eVar2;
  file_handle_type handle;
  error_code *error_local;
  size_type length_local;
  size_type offset_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path_local;
  basic_mmap<(mio::access_mode)0,_char> *this_local;
  
  std::error_code::clear(error);
  bVar1 = detail::empty<std::__cxx11::string,bool,void>(path);
  if (bVar1) {
    eVar2 = std::make_error_code(invalid_argument);
    *(ulong *)error = CONCAT44(handle,eVar2._M_value);
    error->_M_cat = eVar2._M_cat;
  }
  else {
    handle_00 = detail::open_file<std::__cxx11::string>(path,read,error);
    bVar1 = std::error_code::operator_cast_to_bool(error);
    if (!bVar1) {
      basic_mmap<(mio::access_mode)0,_char>::map
                ((basic_mmap<(mio::access_mode)0,_char> *)this,handle_00,offset,length,error);
      bVar1 = std::error_code::operator_cast_to_bool(error);
      if (!bVar1) {
        this[0x1c] = (basic_mmap<(mio::access_mode)0,char>)0x1;
      }
    }
  }
  return;
}

Assistant:

void basic_mmap<AccessMode, ByteT>::map(const String& path, const size_type offset,
        const size_type length, std::error_code& error)
{
    error.clear();
    if(detail::empty(path))
    {
        error = std::make_error_code(std::errc::invalid_argument);
        return;
    }
    const auto handle = detail::open_file(path, AccessMode, error);
    if(error)
    {
        return;
    }

    map(handle, offset, length, error);
    // This MUST be after the call to map, as that sets this to true.
    if(!error)
    {
        is_handle_internal_ = true;
    }
}